

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::verifyRenderResult
          (LineRenderCase *this,IterationConfig *config)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QueryDirection QVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  RenderTarget *this_00;
  TestLog *pTVar13;
  MessageBuilder *pMVar14;
  ObjectWrapper *this_01;
  float fVar15;
  float fVar16;
  float local_df4;
  ConstPixelBufferAccess local_de8;
  allocator<char> local_db9;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  LogImage local_d70;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  LogImageSet local_c90;
  MessageBuilder local_c50;
  ConstPixelBufferAccess local_ad0;
  allocator<char> local_aa1;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  LogImage local_a58;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  LogImageSet local_978;
  MessageBuilder local_938;
  int local_7b4;
  MessageBuilder local_7b0;
  ConstPixelBufferAccess local_630;
  byte local_605;
  int local_604;
  undefined1 local_600 [3];
  deUint8 result_1;
  int x;
  byte local_5d5;
  int local_5d4;
  undefined1 local_5d0 [3];
  deUint8 result;
  int y;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  MessageBuilder local_598;
  MessageBuilder local_418;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  float local_284;
  float local_280;
  float local_27c;
  float local_278;
  float local_274;
  float local_270 [4];
  MessageBuilder local_260;
  byte local_db;
  byte local_da;
  byte local_d9;
  int local_d8;
  bool hwIssueRelaxationRequired;
  bool msaaRelaxationRequired;
  int iStack_d4;
  bool anyError;
  int columnScanResult [6];
  int local_b8;
  int local_b4;
  int rowScanResult [6];
  undefined1 local_98 [4];
  int messageLimitCounter;
  Surface viewportSurface;
  IVec4 verificationArea;
  IVec2 expectedVerticalLines;
  IVec2 expectedHorizontalLines;
  IVec4 viewportPatternArea;
  IVec4 viewportBBoxArea;
  float lineWidth;
  ProjectedBBox projectedBBox;
  bool isMsaa;
  Functions *gl;
  IterationConfig *config_local;
  LineRenderCase *this_local;
  
  pRVar12 = Context::getRenderContext((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar4 = (*pRVar12->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar4);
  this_00 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar4 = tcu::RenderTarget::getNumSamples(this_00);
  projectedBBox.max.m_data[1]._3_1_ = 1 < iVar4;
  projectBoundingBox((ProjectedBBox *)(viewportBBoxArea.m_data + 3),&config->bbox);
  if ((this->m_isWideLineCase & 1U) == 0) {
    local_df4 = 1.0;
  }
  else {
    local_df4 = (float)this->m_wideLineLineWidth;
  }
  viewportBBoxArea.m_data[2] = (int)local_df4;
  getViewportBoundingBoxArea
            ((anon_unknown_1 *)(viewportPatternArea.m_data + 2),
             (ProjectedBBox *)(viewportBBoxArea.m_data + 3),&config->viewportSize,local_df4);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)&expectedHorizontalLines,(Vec2 *)this,&config->patternPos,
             (IVec2 *)&config->patternSize,(int)config + 8);
  iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  fVar15 = tcu::Vector<float,_2>::y(&config->patternPos);
  fVar16 = tcu::Vector<float,_2>::y(&config->patternSize);
  QVar6 = tcu::Vector<int,_2>::y(&config->viewportSize);
  getNumberOfLinesRange
            ((LineRenderCase *)&expectedVerticalLines,(int)this,iVar4,fVar15,fVar16,iVar5,QVar6);
  iVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  fVar15 = tcu::Vector<float,_2>::x(&config->patternPos);
  fVar16 = tcu::Vector<float,_2>::x(&config->patternSize);
  QVar6 = tcu::Vector<int,_2>::x(&config->viewportSize);
  getNumberOfLinesRange
            ((LineRenderCase *)(verificationArea.m_data + 2),(int)this,iVar4,fVar15,fVar16,iVar5,
             QVar6);
  iVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar4 = de::max<int>(iVar4,0);
  iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar5 = de::max<int>(iVar5,0);
  iVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar8 = tcu::Vector<int,_2>::x(&config->viewportSize);
  iVar7 = de::min<int>(iVar7,iVar8);
  iVar8 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
  iVar9 = tcu::Vector<int,_2>::y(&config->viewportSize);
  iVar8 = de::min<int>(iVar8,iVar9);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap,iVar4,iVar5,iVar7,iVar8);
  iVar4 = tcu::Vector<int,_2>::x(&config->viewportSize);
  iVar5 = tcu::Vector<int,_2>::y(&config->viewportSize);
  tcu::Surface::Surface((Surface *)local_98,iVar4,iVar5);
  rowScanResult[5] = 8;
  memset(&local_b8,0,0x18);
  memset(&local_d8,0,0x18);
  local_d9 = 0;
  local_da = 0;
  local_db = 0;
  if (((this->super_BBoxRenderCase).m_calcPerPrimitiveBBox & 1U) == 0) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_260,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_260,(char (*) [38])"Projected bounding box: (clip space)\n");
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])"\tx: [");
    local_270[0] = tcu::Vector<float,_3>::x((Vector<float,_3> *)(viewportBBoxArea.m_data + 3));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,local_270);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf95497);
    local_274 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_274);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xfa5e60);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])"\ty: [");
    local_278 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(viewportBBoxArea.m_data + 3));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_278);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf95497);
    local_27c = tcu::Vector<float,_3>::y((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_27c);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xfa5e60);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])"\tz: [");
    local_280 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(viewportBBoxArea.m_data + 3));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_280);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf95497);
    local_284 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(projectedBBox.min.m_data + 1));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_284);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xfa5e60);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [26])"In viewport coordinates:\n");
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])"\tx: [");
    local_288 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_288);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xf95514);
    local_28c = tcu::Vector<int,_4>::z((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_28c);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xfa5e60);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])"\ty: [");
    local_290 = tcu::Vector<int,_4>::y((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_290);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xf95514);
    local_294 = tcu::Vector<int,_4>::w((Vector<int,_4> *)(viewportPatternArea.m_data + 2));
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_294);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xfa5e60);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (pMVar14,(char (*) [51])
                                 "Verifying render results within the bounding box:\n");
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_260);
  }
  else {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_418,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<(&local_418,(char (*) [25])"Verifying render result:");
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_418);
  }
  pTVar13 = tcu::TestContext::getLog
                      ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_598,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<
                      (&local_598,
                       (char (*) [90])
                       "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
                      );
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])"\t[");
  local_59c = tcu::Vector<int,_2>::x(&expectedVerticalLines);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_59c);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xf95514);
  local_5a0 = tcu::Vector<int,_2>::y(&expectedVerticalLines);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_5a0);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [21])"] horizontal lines.\n");
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])"\t[");
  local_5a4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(verificationArea.m_data + 2));
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_5a4);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0xf95514);
  local_5a8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(verificationArea.m_data + 2));
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_5a8);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [19])"] vertical lines.\n");
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_598);
  bVar3 = de::details::UniqueBase::operator_cast_to_bool
                    ((UniqueBase *)&(this->super_BBoxRenderCase).m_fbo);
  if (bVar3) {
    pcVar2 = *(code **)(stack0xffffffffffffffe0 + 0x78);
    this_01 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ::operator*(&(this->super_BBoxRenderCase).m_fbo.
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                          )->super_ObjectWrapper;
    dVar10 = glu::ObjectWrapper::operator*(this_01);
    (*pcVar2)(0x8ca8,dVar10);
  }
  pRVar12 = Context::getRenderContext((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar4 = tcu::Vector<int,_2>::x(&config->viewportPos);
  iVar5 = tcu::Vector<int,_2>::y(&config->viewportPos);
  tcu::Surface::getAccess((PixelBufferAccess *)local_5d0,(Surface *)local_98);
  glu::readPixels(pRVar12,iVar4,iVar5,(PixelBufferAccess *)local_5d0);
  iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
  iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&expectedHorizontalLines);
  local_5d4 = de::max<int>(iVar4,iVar5);
  while( true ) {
    iVar4 = local_5d4;
    iVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
    iVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&expectedHorizontalLines);
    iVar5 = de::min<int>(iVar5,iVar7);
    if (iVar5 <= iVar4) break;
    tcu::Surface::getAccess((PixelBufferAccess *)local_600,(Surface *)local_98);
    iVar4 = local_5d4;
    psVar1 = &viewportSurface.m_pixels.m_cap;
    iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)psVar1);
    iVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)psVar1);
    iVar8 = tcu::Vector<int,_4>::x((Vector<int,_4> *)psVar1);
    iVar9 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&expectedHorizontalLines);
    iVar8 = de::max<int>(iVar8,iVar9);
    iVar9 = tcu::Vector<int,_4>::z((Vector<int,_4> *)psVar1);
    iVar11 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&expectedHorizontalLines);
    iVar9 = de::min<int>(iVar9,iVar11);
    local_5d5 = scanRow(this,(ConstPixelBufferAccess *)local_600,iVar4,iVar5,iVar7,iVar8,iVar9,
                        (IVec2 *)(verificationArea.m_data + 2),rowScanResult + 5);
    if ((local_5d5 & 1) == 0) {
      local_b8 = local_b8 + 1;
    }
    if ((local_5d5 & 0x10) == 0) {
      if ((local_5d5 & 0x40) == 0) {
        rowScanResult[2] = rowScanResult[2] + 1;
      }
      else {
        rowScanResult[3] = rowScanResult[3] + 1;
      }
    }
    else if ((local_5d5 & 2) == 0) {
      if (((this->m_isWideLineCase & 1U) == 0) || ((projectedBBox.max.m_data[1]._3_1_ & 1) == 0)) {
        if (((local_5d5 & 8) == 0) && ((local_5d5 & 4) != 0)) {
          rowScanResult[0] = rowScanResult[0] + 1;
        }
        else {
          rowScanResult[1] = rowScanResult[1] + 1;
        }
      }
      else {
        local_b4 = local_b4 + 1;
      }
    }
    local_5d4 = local_5d4 + 1;
  }
  iVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
  iVar5 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&expectedHorizontalLines);
  local_604 = de::max<int>(iVar4,iVar5);
  while( true ) {
    iVar4 = local_604;
    iVar5 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&viewportSurface.m_pixels.m_cap);
    iVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&expectedHorizontalLines);
    iVar5 = de::min<int>(iVar5,iVar7);
    if (iVar5 <= iVar4) break;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_630,(Surface *)local_98);
    iVar4 = local_604;
    psVar1 = &viewportSurface.m_pixels.m_cap;
    iVar5 = tcu::Vector<int,_4>::y((Vector<int,_4> *)psVar1);
    iVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)psVar1);
    iVar8 = tcu::Vector<int,_4>::y((Vector<int,_4> *)psVar1);
    iVar9 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&expectedHorizontalLines);
    iVar8 = de::min<int>(iVar8,iVar9);
    iVar9 = tcu::Vector<int,_4>::w((Vector<int,_4> *)psVar1);
    iVar11 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&expectedHorizontalLines);
    iVar9 = de::min<int>(iVar9,iVar11);
    local_605 = scanColumn(this,&local_630,iVar4,iVar5,iVar7,iVar8,iVar9,&expectedVerticalLines,
                           rowScanResult + 5);
    if ((local_605 & 1) == 0) {
      local_d8 = local_d8 + 1;
    }
    if ((local_605 & 0x10) == 0) {
      if ((local_605 & 0x40) == 0) {
        columnScanResult[2] = columnScanResult[2] + 1;
      }
      else {
        columnScanResult[3] = columnScanResult[3] + 1;
      }
    }
    else if ((local_605 & 2) == 0) {
      if (((this->m_isWideLineCase & 1U) == 0) || ((projectedBBox.max.m_data[1]._3_1_ & 1) == 0)) {
        if (((local_605 & 8) == 0) && ((local_605 & 4) != 0)) {
          columnScanResult[0] = columnScanResult[0] + 1;
        }
        else {
          columnScanResult[1] = columnScanResult[1] + 1;
        }
      }
      else {
        iStack_d4 = iStack_d4 + 1;
      }
    }
    local_604 = local_604 + 1;
  }
  if ((columnScanResult[1] == 0) && (rowScanResult[1] == 0)) {
    if ((columnScanResult[2] == 0) && (rowScanResult[2] == 0)) {
      if ((iStack_d4 == 0) && (local_b4 == 0)) {
        if ((columnScanResult[0] == 0) && (rowScanResult[0] == 0)) {
          if (local_d8 == 0) {
            if (local_b8 != 0) {
              if (columnScanResult[3] == 0) {
                local_d9 = 1;
              }
              else {
                local_db = 1;
              }
            }
          }
          else if (rowScanResult[3] == 0) {
            local_d9 = 1;
          }
          else {
            local_db = 1;
          }
        }
        else {
          local_db = 1;
        }
      }
      else {
        local_da = 1;
      }
    }
    else {
      local_d9 = 1;
    }
  }
  else {
    local_d9 = 1;
  }
  if ((((local_d9 & 1) == 0) && ((local_da & 1) == 0)) && ((local_db & 1) == 0)) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_c50,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<(&local_c50,(char (*) [17])"Result image ok.");
    pTVar13 = tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_cb0,"Images",&local_cb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd8,"Image verification",&local_cd9);
    tcu::LogImageSet::LogImageSet(&local_c90,&local_cb0,&local_cd8);
    pTVar13 = tcu::TestLog::operator<<(pTVar13,&local_c90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"Viewport",&local_d91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_db8,"Viewport contents",&local_db9);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_de8,(Surface *)local_98);
    tcu::LogImage::LogImage
              (&local_d70,&local_d90,&local_db8,&local_de8,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar13 = tcu::TestLog::operator<<(pTVar13,&local_d70);
    tcu::TestLog::operator<<(pTVar13,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_d70);
    std::__cxx11::string::~string((string *)&local_db8);
    std::allocator<char>::~allocator(&local_db9);
    std::__cxx11::string::~string((string *)&local_d90);
    std::allocator<char>::~allocator(&local_d91);
    tcu::LogImageSet::~LogImageSet(&local_c90);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::allocator<char>::~allocator(&local_cd9);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::allocator<char>::~allocator(&local_cb1);
    tcu::MessageBuilder::~MessageBuilder(&local_c50);
  }
  else {
    if (rowScanResult[5] < 0) {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode
                           .m_testCtx);
      tcu::TestLog::operator<<(&local_7b0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<(&local_7b0,(char (*) [9])"Omitted ");
      local_7b4 = -rowScanResult[5];
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_7b4);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(char (*) [32])" row/column error descriptions.");
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7b0);
    }
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_938,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        (&local_938,(char (*) [27])"Image verification failed.");
    pTVar13 = tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"Images",&local_999);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c0,"Image verification",&local_9c1);
    tcu::LogImageSet::LogImageSet(&local_978,&local_998,&local_9c0);
    pTVar13 = tcu::TestLog::operator<<(pTVar13,&local_978);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"Viewport",&local_a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_aa0,"Viewport contents",&local_aa1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_ad0,(Surface *)local_98);
    tcu::LogImage::LogImage
              (&local_a58,&local_a78,&local_aa0,&local_ad0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar13 = tcu::TestLog::operator<<(pTVar13,&local_a58);
    tcu::TestLog::operator<<(pTVar13,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_a58);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::allocator<char>::~allocator(&local_aa1);
    std::__cxx11::string::~string((string *)&local_a78);
    std::allocator<char>::~allocator(&local_a79);
    tcu::LogImageSet::~LogImageSet(&local_978);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::allocator<char>::~allocator(&local_9c1);
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
    tcu::MessageBuilder::~MessageBuilder(&local_938);
    if ((local_d9 & 1) == 0) {
      if ((local_db & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_COMPATIBILITY_WARNING,
                   "Multisampled wide line verification failed");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_QUALITY_WARNING,"Line width verification failed");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                 ,QP_TEST_RESULT_FAIL,"Image verification failed");
    }
  }
  tcu::Surface::~Surface((Surface *)local_98);
  return;
}

Assistant:

void LineRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	const bool				isMsaa						= m_context.getRenderTarget().getNumSamples() > 1;
	const ProjectedBBox		projectedBBox				= projectBoundingBox(config.bbox);
	const float				lineWidth					= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);
	const tcu::IVec4		viewportBBoxArea			= getViewportBoundingBoxArea(projectedBBox, config.viewportSize, lineWidth);
	const tcu::IVec4		viewportPatternArea			= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	const tcu::IVec2		expectedHorizontalLines		= getNumberOfLinesRange(viewportBBoxArea.y(), viewportBBoxArea.w(), config.patternPos.y(), config.patternSize.y(), config.viewportSize.y(), DIRECTION_VERTICAL);
	const tcu::IVec2		expectedVerticalLines		= getNumberOfLinesRange(viewportBBoxArea.x(), viewportBBoxArea.z(), config.patternPos.x(), config.patternSize.x(), config.viewportSize.x(), DIRECTION_HORIZONTAL);
	const tcu::IVec4		verificationArea			= tcu::IVec4(de::max(viewportBBoxArea.x(), 0),
																	 de::max(viewportBBoxArea.y(), 0),
																	 de::min(viewportBBoxArea.z(), config.viewportSize.x()),
																	 de::min(viewportBBoxArea.w(), config.viewportSize.y()));

	tcu::Surface			viewportSurface				(config.viewportSize.x(), config.viewportSize.y());
	int						messageLimitCounter			= 8;

	enum ScanResultCodes
	{
		SCANRESULT_NUM_LINES_ERR	= 0,
		SCANRESULT_LINE_WIDTH_MSAA	= 1,
		SCANRESULT_LINE_WIDTH_WARN	= 2,
		SCANRESULT_LINE_WIDTH_ERR	= 3,
		SCANRESULT_LINE_CONT_ERR	= 4,
		SCANRESULT_LINE_CONT_WARN	= 5,
		SCANRESULT_LINE_LAST
	};

	int						rowScanResult[SCANRESULT_LINE_LAST]		= {0, 0, 0, 0, 0, 0};
	int						columnScanResult[SCANRESULT_LINE_LAST]	= {0, 0, 0, 0, 0, 0};
	bool					anyError								= false;
	bool					msaaRelaxationRequired					= false;
	bool					hwIssueRelaxationRequired				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box:\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result:"
			<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
			<< "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
			<< "\t[" << expectedHorizontalLines.x() << ", " << expectedHorizontalLines.y() << "] horizontal lines.\n"
			<< "\t[" << expectedVerticalLines.x() << ", " << expectedVerticalLines.y() << "] vertical lines.\n"
		<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	// scan rows
	for (int y = de::max(verificationArea.y(), viewportPatternArea.y()); y < de::min(verificationArea.w(), viewportPatternArea.w()); ++y)
	{
		const deUint8 result = scanRow(viewportSurface.getAccess(),
									   y,
									   verificationArea.x(),
									   verificationArea.z(),
									   de::max(verificationArea.x(), viewportPatternArea.x()),
									   de::min(verificationArea.z(), viewportPatternArea.z()),
									   expectedVerticalLines,
									   messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			rowScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				rowScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				rowScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				rowScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				rowScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				rowScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	// scan columns
	for (int x = de::max(verificationArea.x(), viewportPatternArea.x()); x < de::min(verificationArea.z(), viewportPatternArea.z()); ++x)
	{
		const deUint8 result = scanColumn(viewportSurface.getAccess(),
										  x,
										  verificationArea.y(),
										  verificationArea.w(),
										  de::min(verificationArea.y(), viewportPatternArea.y()),
										  de::min(verificationArea.w(), viewportPatternArea.w()),
										  expectedHorizontalLines,
										  messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			columnScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				columnScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				columnScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				columnScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				columnScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				columnScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	if (columnScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0)
		anyError = true;
	else if(columnScanResult[SCANRESULT_LINE_CONT_ERR] != 0 || rowScanResult[SCANRESULT_LINE_CONT_ERR] != 0)
		anyError = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0)
		msaaRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0)
		hwIssueRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a columnw and row line continuity check reported a warning (not an error) -> line width precision issue
		if (rowScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && rowScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}
	else if (rowScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a row and column line continuity check reported a warning (not an error) -> line width precision issue
		if (columnScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && columnScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}

	if (anyError || msaaRelaxationRequired || hwIssueRelaxationRequired)
	{
		if (messageLimitCounter < 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Omitted " << (-messageLimitCounter) << " row/column error descriptions." << tcu::TestLog::EndMessage;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		if (anyError)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
		else if (hwIssueRelaxationRequired)
		{
			// Line width hw issue
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Line width verification failed");
		}
		else
		{
			// MSAA wide lines are optional
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Multisampled wide line verification failed");
		}
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}